

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

Interval * __thiscall
vkt::shaderexecutor::Functions::Mul::doApply
          (Interval *__return_storage_ptr__,Mul *this,EvalContext *ctx,IArgs *iargs)

{
  Interval *xi;
  Interval *yi;
  deRoundingMode dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  Interval ret;
  Interval local_50;
  Interval local_38;
  
  xi = iargs->a;
  yi = iargs->b;
  if ((xi->m_hasNaN & 1U) == 0) {
    dVar5 = xi->m_lo;
    dVar2 = xi->m_hi;
    if ((((dVar5 <= dVar2) && (dVar5 != -INFINITY)) && (dVar2 != INFINITY)) &&
       ((yi->m_hasNaN & 1U) == 0)) {
      dVar3 = yi->m_lo;
      dVar4 = yi->m_hi;
      if (((dVar3 <= dVar4) && (dVar3 != -INFINITY)) && (dVar4 != INFINITY)) {
        local_50.m_hasNaN = false;
        local_50.m_lo = INFINITY;
        local_50.m_hi = -INFINITY;
        dVar7 = -dVar2;
        dVar6 = dVar7;
        if (dVar7 <= dVar2) {
          dVar6 = dVar5;
        }
        if ((dVar6 < 0.0) ||
           ((double)(~-(ulong)(dVar2 < dVar7) & (ulong)dVar3 |
                    (ulong)-dVar4 & -(ulong)(dVar2 < dVar7)) < 0.0)) {
          if ((dVar6 < 0.0) ||
             (0.0 < (double)(~-(ulong)(dVar2 < 0.0) & (ulong)dVar4 |
                            (ulong)-dVar3 & -(ulong)(dVar2 < 0.0)))) goto LAB_008caa45;
          dVar1 = deGetRoundingMode();
          deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
          dVar5 = iargs->a->m_hi;
          dVar2 = iargs->b->m_lo;
          deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
          dVar5 = dVar5 * dVar2;
          local_50.m_hasNaN = NAN(dVar5);
          dVar2 = -INFINITY;
          if (!local_50.m_hasNaN) {
            dVar2 = dVar5;
          }
          dVar3 = INFINITY;
          if (!local_50.m_hasNaN) {
            dVar3 = dVar5;
          }
          dVar6 = iargs->a->m_lo * iargs->b->m_hi;
          dVar5 = -INFINITY;
          dVar4 = INFINITY;
          if (!NAN(dVar6)) {
            dVar5 = dVar6;
            dVar4 = dVar6;
          }
          local_50.m_hasNaN = local_50.m_hasNaN || NAN(dVar6);
          local_50.m_lo =
               (double)(~-(ulong)(dVar3 <= dVar4) & (ulong)dVar4 |
                       (ulong)dVar3 & -(ulong)(dVar3 <= dVar4));
          local_50.m_hi =
               (double)(~-(ulong)(dVar5 <= dVar2) & (ulong)dVar5 |
                       (ulong)dVar2 & -(ulong)(dVar5 <= dVar2));
          deSetRoundingMode(dVar1);
        }
        else {
          dVar1 = deGetRoundingMode();
          deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
          dVar5 = iargs->a->m_lo;
          dVar2 = iargs->b->m_lo;
          deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
          dVar5 = dVar5 * dVar2;
          local_50.m_hasNaN = NAN(dVar5);
          dVar2 = -INFINITY;
          if (!local_50.m_hasNaN) {
            dVar2 = dVar5;
          }
          dVar3 = INFINITY;
          if (!local_50.m_hasNaN) {
            dVar3 = dVar5;
          }
          dVar6 = iargs->a->m_hi * iargs->b->m_hi;
          dVar5 = -INFINITY;
          dVar4 = INFINITY;
          if (!NAN(dVar6)) {
            dVar5 = dVar6;
            dVar4 = dVar6;
          }
          local_50.m_hasNaN = local_50.m_hasNaN || NAN(dVar6);
          local_50.m_lo =
               (double)(~-(ulong)(dVar3 <= dVar4) & (ulong)dVar4 |
                       (ulong)dVar3 & -(ulong)(dVar3 <= dVar4));
          local_50.m_hi =
               (double)(~-(ulong)(dVar5 <= dVar2) & (ulong)dVar5 |
                       (ulong)dVar2 & -(ulong)(dVar5 <= dVar2));
          deSetRoundingMode(dVar1);
        }
        tcu::FloatFormat::roundOut(&local_38,&ctx->format,&local_50,true);
        tcu::FloatFormat::convert(__return_storage_ptr__,&ctx->format,&local_38);
        return __return_storage_ptr__;
      }
    }
  }
LAB_008caa45:
  FloatFunc2::applyMonotone(__return_storage_ptr__,(FloatFunc2 *)this,ctx,xi,yi);
  return __return_storage_ptr__;
}

Assistant:

Interval	doApply		(const EvalContext&	ctx, const IArgs& iargs) const
	{
		Interval a = iargs.a;
		Interval b = iargs.b;

		// Fast-path for common case
		if (a.isOrdinary() && b.isOrdinary())
		{
			Interval ret;
			if (a.hi() < 0)
			{
				a = -a;
				b = -b;
			}
			if (a.lo() >= 0 && b.lo() >= 0)
			{
				TCU_SET_INTERVAL_BOUNDS(ret, prod,
										prod = iargs.a.lo() * iargs.b.lo(),
										prod = iargs.a.hi() * iargs.b.hi());
				return ctx.format.convert(ctx.format.roundOut(ret, true));
			}
			if (a.lo() >= 0 && b.hi() <= 0)
			{
				TCU_SET_INTERVAL_BOUNDS(ret, prod,
										prod = iargs.a.hi() * iargs.b.lo(),
										prod = iargs.a.lo() * iargs.b.hi());
				return ctx.format.convert(ctx.format.roundOut(ret, true));
			}
		}
		return this->applyMonotone(ctx, iargs.a, iargs.b);
	}